

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Index * sqlite3FindIndex(sqlite3 *db,char *zName,char *zDb)

{
  uint uVar1;
  sqlite3 *db_00;
  long lVar2;
  int iVar3;
  HashElem *pHVar4;
  uint iDb;
  uint uVar5;
  
  uVar1 = db->nDb;
  if (0 < (int)uVar1) {
    db_00 = (sqlite3 *)db->aDb;
    uVar5 = 0;
    do {
      iDb = uVar5 < 2 ^ uVar5;
      lVar2 = *(long *)(db_00->aLimit + (ulong)iDb * 8 + -0x1c);
      if ((zDb == (char *)0x0) || (iVar3 = sqlite3DbIsNamed(db_00,iDb,zDb), iVar3 != 0)) {
        pHVar4 = findElementWithHash((Hash *)(lVar2 + 0x20),zName,(uint *)0x0);
        if ((Index *)pHVar4->data != (Index *)0x0) {
          return (Index *)pHVar4->data;
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  return (Index *)0x0;
}

Assistant:

SQLITE_PRIVATE Index *sqlite3FindIndex(sqlite3 *db, const char *zName, const char *zDb){
  Index *p = 0;
  int i;
  /* All mutexes are required for schema access.  Make sure we hold them. */
  assert( zDb!=0 || sqlite3BtreeHoldsAllMutexes(db) );
  for(i=OMIT_TEMPDB; i<db->nDb; i++){
    int j = (i<2) ? i^1 : i;  /* Search TEMP before MAIN */
    Schema *pSchema = db->aDb[j].pSchema;
    assert( pSchema );
    if( zDb && sqlite3DbIsNamed(db, j, zDb)==0 ) continue;
    assert( sqlite3SchemaMutexHeld(db, j, 0) );
    p = sqlite3HashFind(&pSchema->idxHash, zName);
    if( p ) break;
  }
  return p;
}